

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_signature_parse_compact
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *input64)

{
  int local_70;
  uint local_6c;
  int overflow;
  int ret;
  secp256k1_scalar s;
  secp256k1_scalar r;
  uchar *input64_local;
  secp256k1_ecdsa_signature *sig_local;
  secp256k1_context *ctx_local;
  
  local_6c = 1;
  local_70 = 0;
  if (sig == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sig != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (input64 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"input64 != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_scalar_set_b32((secp256k1_scalar *)(s.d + 3),input64,&local_70);
    local_6c = ((local_70 != 0 ^ 0xffU) & 1) & local_6c;
    secp256k1_scalar_set_b32((secp256k1_scalar *)&overflow,input64 + 0x20,&local_70);
    local_6c = ((local_70 != 0 ^ 0xffU) & 1) & local_6c;
    if (local_6c == 0) {
      memset(sig,0,0x40);
    }
    else {
      secp256k1_ecdsa_signature_save
                (sig,(secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)&overflow);
    }
    ctx_local._4_4_ = local_6c;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_signature_parse_compact(const secp256k1_context* ctx, secp256k1_ecdsa_signature* sig, const unsigned char *input64) {
    secp256k1_scalar r, s;
    int ret = 1;
    int overflow = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(input64 != NULL);

    secp256k1_scalar_set_b32(&r, &input64[0], &overflow);
    ret &= !overflow;
    secp256k1_scalar_set_b32(&s, &input64[32], &overflow);
    ret &= !overflow;
    if (ret) {
        secp256k1_ecdsa_signature_save(sig, &r, &s);
    } else {
        memset(sig, 0, sizeof(*sig));
    }
    return ret;
}